

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::GetMessage
          (ExtensionSet *this,int number,MessageLite *default_value)

{
  byte bVar1;
  int iVar2;
  Extension *pEVar3;
  LogMessage *pLVar4;
  undefined4 extraout_var;
  LogFinisher local_d9;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  MessageLite *pMVar5;
  
  pEVar3 = FindOrNull(this,number);
  pMVar5 = default_value;
  if (pEVar3 != (Extension *)0x0) {
    if (pEVar3->is_repeated != false) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x274);
      pLVar4 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (OPTIONAL_FIELD): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_a0,pLVar4);
      LogMessage::~LogMessage(&local_68);
    }
    bVar1 = pEVar3->type;
    if ((byte)(bVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x3f);
      pLVar4 = LogMessage::operator<<
                         (&local_a0,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=((LogFinisher *)&local_d8,pLVar4);
      LogMessage::~LogMessage(&local_a0);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 10) {
      LogMessage::LogMessage
                (&local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x274);
      pLVar4 = LogMessage::operator<<
                         (&local_d8,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_d9,pLVar4);
      LogMessage::~LogMessage(&local_d8);
    }
    pMVar5 = (pEVar3->field_0).message_value;
    if ((pEVar3->field_0xa & 0x10) != 0) {
      iVar2 = (*pMVar5->_vptr_MessageLite[3])(pMVar5,default_value,this->arena_);
      pMVar5 = (MessageLite *)CONCAT44(extraout_var,iVar2);
    }
  }
  return pMVar5;
}

Assistant:

const MessageLite& ExtensionSet::GetMessage(
    int number, const MessageLite& default_value) const {
  const Extension* extension = FindOrNull(number);
  if (extension == nullptr) {
    // Not present.  Return the default value.
    return default_value;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    if (extension->is_lazy) {
      return extension->lazymessage_value->GetMessage(default_value, arena_);
    } else {
      return *extension->message_value;
    }
  }
}